

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_InSetIgnoreCase_Test::TestBody(TApp_InSetIgnoreCase_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_430;
  AssertHelper local_3d0;
  Message local_3c8 [2];
  ArgumentMismatch *anon_var_0_1;
  char *pcStack_3b0;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  string local_378 [32];
  iterator local_358;
  size_type local_350;
  AssertHelper local_348;
  Message local_340 [2];
  ConversionError *anon_var_0;
  char *pcStack_328;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0 [32];
  iterator local_2d0;
  size_type local_2c8;
  AssertHelper local_2c0;
  Message local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270 [32];
  iterator local_250;
  size_type local_248;
  AssertHelper local_240;
  Message local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0 [32];
  iterator local_1d0;
  size_type local_1c8;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170 [32];
  iterator local_150;
  size_type local_148;
  allocator local_139;
  string local_138;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_116;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_115;
  undefined1 local_114;
  allocator local_113;
  allocator local_112;
  allocator local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  string local_c8 [32];
  iterator local_a8;
  size_type local_a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string choice;
  TApp_InSetIgnoreCase_Test *this_local;
  
  choice.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"-q,--quick",&local_51);
  local_114 = 1;
  local_110 = &local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"one",&local_111);
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Two",&local_112);
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"THREE",&local_113);
  local_114 = 0;
  local_a8 = &local_108;
  local_a0 = 3;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_116);
  __l_04._M_len = local_a0;
  __l_04._M_array = local_a8;
  CLI::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_98,__l_04,&local_115,&local_116);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"",&local_139);
  CLI::App::add_set_ignore_case
            (&(this->super_TApp).app,&local_50,(string *)local_30,&local_98,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  CLI::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_98);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_116);
  local_430 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8;
  do {
    local_430 = local_430 + -1;
    std::__cxx11::string::~string((string *)local_430);
  } while (local_430 != &local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_113);
  std::allocator<char>::~allocator((allocator<char> *)&local_112);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  gtest_ar.message_.ptr_._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_190,"--quick",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"One",(allocator *)((long)&gtest_ar.message_.ptr_ + 6));
  gtest_ar.message_.ptr_._5_1_ = 0;
  local_150 = &local_190;
  local_148 = 2;
  __l_03._M_len = 2;
  __l_03._M_array = local_150;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_03);
  local_468 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_150;
  do {
    local_468 = local_468 + -1;
    std::__cxx11::string::~string((string *)local_468);
  } while (local_468 != &local_190);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_1b0,"\"one\"","choice",(char (*) [4])0x1cda88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x373,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_ar_1.message_.ptr_._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_210,"--quick",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"two",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 6));
  gtest_ar_1.message_.ptr_._5_1_ = 0;
  local_1d0 = &local_210;
  local_1c8 = 2;
  __l_02._M_len = 2;
  __l_02._M_array = local_1d0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_02);
  local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0;
  do {
    local_500 = local_500 + -1;
    std::__cxx11::string::~string((string *)local_500);
  } while (local_500 != &local_210);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_230,"\"Two\"","choice",(char (*) [4])"Two",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x378,pcVar2);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_ar_2.message_.ptr_._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_290,"--quick",(allocator *)((long)&gtest_ar_2.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"ThrEE",(allocator *)((long)&gtest_ar_2.message_.ptr_ + 6))
  ;
  gtest_ar_2.message_.ptr_._5_1_ = 0;
  local_250 = &local_290;
  local_248 = 2;
  __l_01._M_len = 2;
  __l_01._M_array = local_250;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_01);
  local_570 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250;
  do {
    local_570 = local_570 + -1;
    std::__cxx11::string::~string((string *)local_570);
  } while (local_570 != &local_290);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_2b0,"\"THREE\"","choice",(char (*) [6])"THREE",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x37d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_310,"--quick",(allocator *)((long)&gtest_msg.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"four",(allocator *)((long)&gtest_msg.value + 6));
  gtest_msg.value._5_1_ = 0;
  local_2d0 = &local_310;
  local_2c8 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_2d0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_5e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d0;
  do {
    local_5e0 = local_5e0 + -1;
    std::__cxx11::string::~string((string *)local_5e0);
  } while (local_5e0 != &local_310);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffcd8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffcd8);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_328 = 
      "Expected: run() throws an exception of type CLI::ConversionError.\n  Actual: it throws nothing."
      ;
      goto LAB_0013fcd7;
    }
  }
  else {
LAB_0013fcd7:
    testing::Message::Message(local_340);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x381,pcStack_328);
    testing::internal::AssertHelper::operator=(&local_348,local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    testing::Message::~Message(local_340);
  }
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_1.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_398,"--quick=one",(allocator *)((long)&gtest_msg_1.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"--quick=two",(allocator *)((long)&gtest_msg_1.value + 6));
  gtest_msg_1.value._5_1_ = 0;
  local_358 = &local_398;
  local_350 = 2;
  __l._M_len = 2;
  __l._M_array = local_358;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_648 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_358;
  do {
    local_648 = local_648 + -1;
    std::__cxx11::string::~string((string *)local_648);
  } while (local_648 != &local_398);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffc50,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffc50);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_1._7_1_ & 1) != 0) goto LAB_00140129;
    pcStack_3b0 = 
    "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_3c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_3d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x385,pcStack_3b0);
  testing::internal::AssertHelper::operator=(&local_3d0,local_3c8);
  testing::internal::AssertHelper::~AssertHelper(&local_3d0);
  testing::Message::~Message(local_3c8);
LAB_00140129:
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(TApp, InSetIgnoreCase) {

    std::string choice;
    app.add_set_ignore_case("-q,--quick", choice, {"one", "Two", "THREE"});

    args = {"--quick", "One"};
    run();
    EXPECT_EQ("one", choice);

    app.reset();
    args = {"--quick", "two"};
    run();
    EXPECT_EQ("Two", choice); // Keeps caps from set

    app.reset();
    args = {"--quick", "ThrEE"};
    run();
    EXPECT_EQ("THREE", choice); // Keeps caps from set

    app.reset();
    args = {"--quick", "four"};
    EXPECT_THROW(run(), CLI::ConversionError);

    app.reset();
    args = {"--quick=one", "--quick=two"};
    EXPECT_THROW(run(), CLI::ArgumentMismatch);
}